

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O0

int ECDSA_sign(int type,uchar *dgst,int dgstlen,uchar *sig,uint *siglen,EC_KEY *eckey)

{
  bool bVar1;
  int iVar2;
  ECDSA_SIG *__p;
  undefined4 extraout_var;
  pointer sig_00;
  undefined4 in_register_00000014;
  uint local_118 [2];
  size_t len;
  CBB cbb;
  unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> local_d8;
  UniquePtr<ECDSA_SIG> s;
  size_t fixed_len;
  uint8_t fixed [132];
  EC_KEY *eckey_local;
  uint *out_sig_len_local;
  uint8_t *sig_local;
  size_t digest_len_local;
  uint8_t *digest_local;
  int type_local;
  
  if ((*(long *)(eckey + 0x28) != 0) && (*(long *)(*(long *)(eckey + 0x28) + 0x20) != 0)) {
    iVar2 = (**(code **)(*(long *)(eckey + 0x28) + 0x20))
                      (dgst,CONCAT44(in_register_00000014,dgstlen),sig,siglen,eckey);
    return iVar2;
  }
  *siglen = 0;
  iVar2 = ecdsa_sign_fixed(dgst,CONCAT44(in_register_00000014,dgstlen),(uint8_t *)&fixed_len,
                           (size_t *)&s,0x84,(EC_KEY *)eckey);
  if (iVar2 != 0) {
    __p = ecdsa_sig_from_fixed
                    ((EC_KEY *)eckey,(uint8_t *)&fixed_len,
                     (size_t)s._M_t.super___uniq_ptr_impl<ecdsa_sig_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_ecdsa_sig_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ecdsa_sig_st_*,_false>._M_head_impl);
    std::unique_ptr<ecdsa_sig_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ecdsa_sig_st,bssl::internal::Deleter> *)&local_d8,__p);
    bVar1 = std::operator==(&local_d8,(nullptr_t)0x0);
    if (bVar1) {
      digest_local._4_4_ = 0;
    }
    else {
      iVar2 = ECDSA_size(eckey);
      CBB_init_fixed((CBB *)&len,sig,CONCAT44(extraout_var,iVar2));
      sig_00 = std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::get(&local_d8);
      iVar2 = ECDSA_SIG_marshal((CBB *)&len,sig_00);
      if ((iVar2 == 0) ||
         (iVar2 = CBB_finish((CBB *)&len,(uint8_t **)0x0,(size_t *)local_118), iVar2 == 0)) {
        ERR_put_error(0x1a,0,0x69,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_asn1.cc"
                      ,100);
        digest_local._4_4_ = 0;
      }
      else {
        *siglen = local_118[0];
        digest_local._4_4_ = 1;
      }
    }
    cbb.u._28_4_ = 1;
    std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::~unique_ptr(&local_d8);
    return digest_local._4_4_;
  }
  return 0;
}

Assistant:

int ECDSA_sign(int type, const uint8_t *digest, size_t digest_len, uint8_t *sig,
               unsigned int *out_sig_len, const EC_KEY *eckey) {
  if (eckey->ecdsa_meth && eckey->ecdsa_meth->sign) {
    return eckey->ecdsa_meth->sign(digest, digest_len, sig, out_sig_len,
                                   (EC_KEY *)eckey /* cast away const */);
  }

  *out_sig_len = 0;
  uint8_t fixed[ECDSA_MAX_FIXED_LEN];
  size_t fixed_len;
  if (!ecdsa_sign_fixed(digest, digest_len, fixed, &fixed_len, sizeof(fixed),
                        eckey)) {
    return 0;
  }

  // TODO(davidben): We can actually do better and go straight from the DER
  // format to the fixed-width format without a malloc.
  bssl::UniquePtr<ECDSA_SIG> s(ecdsa_sig_from_fixed(eckey, fixed, fixed_len));
  if (s == nullptr) {
    return 0;
  }

  CBB cbb;
  CBB_init_fixed(&cbb, sig, ECDSA_size(eckey));
  size_t len;
  if (!ECDSA_SIG_marshal(&cbb, s.get()) || !CBB_finish(&cbb, nullptr, &len)) {
    OPENSSL_PUT_ERROR(ECDSA, ECDSA_R_ENCODE_ERROR);
    return 0;
  }
  *out_sig_len = static_cast<unsigned>(len);
  return 1;
}